

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cheat.cc
# Opt level: O0

void init_cheats(void)

{
  map<std::__cxx11::string,std::unique_ptr<Cheat,std::default_delete<Cheat>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Cheat,std::default_delete<Cheat>>>>>
  *pmVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>_>_>,_bool>
  pVar2;
  unique_ptr<SpeedCheat,_std::default_delete<SpeedCheat>_> local_40;
  _Base_ptr local_38;
  undefined1 local_30;
  unique_ptr<FlyingCheat,_std::default_delete<FlyingCheat>_> local_18;
  unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>_>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>_>_>_>_>_>
  local_10;
  
  std::
  make_unique<std::map<std::__cxx11::string,std::unique_ptr<Cheat,std::default_delete<Cheat>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Cheat,std::default_delete<Cheat>>>>>>
            ();
  std::
  unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>_>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>_>_>_>_>_>
  ::operator=(&cheats_abi_cxx11_,&local_10);
  std::
  unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>_>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>_>_>_>_>_>
  ::~unique_ptr(&local_10);
  display = (Display *)XOpenDisplay(0);
  if (display == (Display *)0x0) {
    perror("XOpenDisplay error");
    exit(1);
  }
  pmVar1 = (map<std::__cxx11::string,std::unique_ptr<Cheat,std::default_delete<Cheat>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Cheat,std::default_delete<Cheat>>>>>
            *)std::
              unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>_>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>_>_>_>_>_>
              ::operator->(&cheats_abi_cxx11_);
  std::make_unique<FlyingCheat>();
  pVar2 = std::
          map<std::__cxx11::string,std::unique_ptr<Cheat,std::default_delete<Cheat>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Cheat,std::default_delete<Cheat>>>>>
          ::emplace<char_const(&)[10],std::unique_ptr<FlyingCheat,std::default_delete<FlyingCheat>>>
                    (pmVar1,(char (*) [10])"fly_hacks",&local_18);
  local_38 = (_Base_ptr)pVar2.first._M_node;
  local_30 = pVar2.second;
  std::unique_ptr<FlyingCheat,_std::default_delete<FlyingCheat>_>::~unique_ptr(&local_18);
  pmVar1 = (map<std::__cxx11::string,std::unique_ptr<Cheat,std::default_delete<Cheat>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Cheat,std::default_delete<Cheat>>>>>
            *)std::
              unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>_>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Cheat,_std::default_delete<Cheat>_>_>_>_>_>_>
              ::operator->(&cheats_abi_cxx11_);
  std::make_unique<SpeedCheat>();
  std::
  map<std::__cxx11::string,std::unique_ptr<Cheat,std::default_delete<Cheat>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Cheat,std::default_delete<Cheat>>>>>
  ::emplace<char_const(&)[12],std::unique_ptr<SpeedCheat,std::default_delete<SpeedCheat>>>
            (pmVar1,(char (*) [12])"speed_hacks",&local_40);
  std::unique_ptr<SpeedCheat,_std::default_delete<SpeedCheat>_>::~unique_ptr(&local_40);
  return;
}

Assistant:

__attribute__((constructor)) static void init_cheats()
{
    cheats = std::make_unique<std::map<std::string, std::unique_ptr<Cheat>>>();
    display = XOpenDisplay(NULL);
    if (display == NULL) {
        perror("XOpenDisplay error");
        exit(1);
    }

    // Register cheats
    cheats->emplace("fly_hacks", std::make_unique<FlyingCheat>());
    cheats->emplace("speed_hacks", std::make_unique<SpeedCheat>());
}